

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  int iVar1;
  sqlite3_value *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int nData;
  void *unaff_retaddr;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int i_00;
  undefined4 in_stack_fffffffffffffff0;
  
  nData = (int)((ulong)in_RDI >> 0x20);
  iVar1 = sqlite3_value_type(in_RDX);
  i_00 = (int)((ulong)in_RDX >> 0x20);
  switch(iVar1) {
  case 1:
    iVar1 = sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    break;
  case 2:
    iVar1 = sqlite3_bind_double((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,
                                (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                ));
    break;
  case 3:
    iVar1 = bindText((sqlite3_stmt *)pValue,rc,unaff_retaddr,nData,
                     (_func_void_void_ptr *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (u8)((ulong)in_RDX >> 0x38));
    break;
  case 4:
    if ((in_RDX->flags & 0x4000) == 0) {
      iVar1 = sqlite3_bind_blob((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,
                                (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                ),0,(_func_void_void_ptr *)0x136914);
    }
    else {
      iVar1 = sqlite3_bind_zeroblob
                        ((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,(int)in_RDX
                        );
    }
    break;
  default:
    iVar1 = sqlite3_bind_null((sqlite3_stmt *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( sqlite3_value_type((sqlite3_value*)pValue) ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      rc = sqlite3_bind_double(pStmt, i, pValue->u.r);
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}